

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileBuffer.cpp
# Opt level: O3

int __thiscall FileBuffer::getBufferPosition(FileBuffer *this,int position)

{
  uint uVar1;
  int *piVar2;
  uint uVar3;
  uint segment;
  int iVar4;
  ulong uVar5;
  uint loadToPosition;
  uint uVar6;
  long lVar7;
  uint loadToPosition_00;
  uint loadToPosition_01;
  
  iVar4 = this->_fileSegmentLength;
  segment = position / iVar4;
  uVar5 = (long)position % (long)iVar4 & 0xffffffff;
  if ((long)this->_segments < 1) {
    loadToPosition = 0xffffffff;
    loadToPosition_01 = 0xffffffff;
  }
  else {
    piVar2 = this->_loadedSegments;
    loadToPosition = 0xffffffff;
    lVar7 = 0;
    loadToPosition_01 = 0xffffffff;
    loadToPosition_00 = 0xffffffff;
    do {
      uVar1 = piVar2[lVar7];
      uVar6 = (uint)lVar7;
      uVar3 = uVar6;
      if ((uVar1 & loadToPosition_00) != 0xffffffff) {
        uVar3 = loadToPosition_00;
      }
      loadToPosition_00 = uVar3;
      if ((loadToPosition_01 == 0xffffffff) || ((int)uVar1 < piVar2[(int)loadToPosition_01])) {
        loadToPosition_01 = uVar6;
      }
      if ((loadToPosition == 0xffffffff) || (piVar2[(int)loadToPosition] < (int)uVar1)) {
        loadToPosition = uVar6;
      }
      if (uVar1 == segment) {
        return (int)uVar5;
      }
      lVar7 = lVar7 + 1;
      uVar5 = (ulong)(uint)((int)uVar5 + iVar4);
    } while (this->_segments != lVar7);
    if (loadToPosition_00 != 0xffffffff) {
      loadSegment(this,segment,loadToPosition_00);
      return position % this->_fileSegmentLength + loadToPosition_00 * this->_fileSegmentLength;
    }
  }
  if (this->_loadedSegments[(int)loadToPosition] < (int)segment) {
    loadSegment(this,segment,loadToPosition_01);
    iVar4 = position % this->_fileSegmentLength + loadToPosition_01 * this->_fileSegmentLength;
  }
  else if ((int)segment < this->_loadedSegments[(int)loadToPosition_01]) {
    loadSegment(this,segment,loadToPosition);
    iVar4 = position % this->_fileSegmentLength + loadToPosition * this->_fileSegmentLength;
  }
  else {
    puts(
        "Unexpected Error! No segment slot found to overwrite! This should never happen. Maybe zero or negative segment count?"
        );
    iVar4 = -1;
  }
  return iVar4;
}

Assistant:

int FileBuffer::getBufferPosition(int position) {
    int segment = getSegmentNumber(position);

    int firstFreeSegment = -1;
    int lowestSegment = -1;
    int highestSegment = -1;

    for (int i = 0; i < _segments; i++) {
        // get first free segment
        if (_loadedSegments[i] == -1 && firstFreeSegment == -1) {
            firstFreeSegment = i;
        }

        // get lowest segment
        if (lowestSegment == -1 || _loadedSegments[i] < _loadedSegments[lowestSegment]) {
            lowestSegment = i;
        }

        // get highest segment
        if (highestSegment == -1 || _loadedSegments[i] > _loadedSegments[highestSegment]) {
            highestSegment = i;
        }

        // Segment already loaded, so just take it
        if (_loadedSegments[i] == segment) {
            return (i * _fileSegmentLength) + (position % _fileSegmentLength);
        }
    }

    //Segment not yet loaded:

    // take a free segment slot, if one is found
    if (firstFreeSegment != -1) {
        loadSegment(segment, firstFreeSegment);
        return (firstFreeSegment * _fileSegmentLength) + (position % _fileSegmentLength);
    }

    // overwrite the lowest segment slot, if segment number is higher than all loaded segments
    if (segment > _loadedSegments[highestSegment]) {
        loadSegment(segment, lowestSegment);
        return (lowestSegment * _fileSegmentLength) + (position % _fileSegmentLength);
    }

    // overwrite the highest segment slot, if segment number is lower than all loaded segments
    if (segment < _loadedSegments[lowestSegment]) {
        loadSegment(segment, highestSegment);
        return (highestSegment * _fileSegmentLength) + (position % _fileSegmentLength);
    }

    printf("Unexpected Error! No segment slot found to overwrite! This should never happen. Maybe zero or negative segment count?\n");
    return -1;
}